

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::global_lu_map_t::resize(global_lu_map_t *this,clock_id_t clock_nb)

{
  map_t *pmVar1;
  map_t *pmVar2;
  ulong uVar3;
  ulong uVar4;
  
  clear(this);
  this->_clock_nb = clock_nb;
  pmVar1 = allocate_map((ulong)clock_nb);
  this->_L = pmVar1;
  pmVar2 = allocate_map((ulong)this->_clock_nb);
  this->_U = pmVar2;
  pmVar1 = this->_L;
  uVar3 = (ulong)(pmVar1->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      (&pmVar1->_fam)[uVar4] = (no_storage_array_t<int>)0xc0000001;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  uVar3 = (ulong)(pmVar2->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      (&pmVar2->_fam)[uVar4] = (no_storage_array_t<int>)0xc0000001;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void global_lu_map_t::resize(tchecker::clock_id_t clock_nb)
{
  clear();

  _clock_nb = clock_nb;
  _L = tchecker::clockbounds::allocate_map(_clock_nb);
  _U = tchecker::clockbounds::allocate_map(_clock_nb);
  tchecker::clockbounds::clear(*_L);
  tchecker::clockbounds::clear(*_U);
}